

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O0

bool_t priIsSmooth(word *a,size_t n,size_t base_count,void *stack)

{
  bool_t bVar1;
  word *pwVar2;
  word *in_RCX;
  word *in_RDX;
  size_t in_RSI;
  word *in_RDI;
  word *t;
  word mod;
  size_t i;
  word local_48;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  word *w;
  word *a_00;
  
  a_00 = in_RCX;
  wwCopy(in_RCX,in_RDI,in_RSI);
  pwVar2 = (word *)wwLoZeroBits(a_00,in_stack_ffffffffffffffd0);
  wwShLo(pwVar2,in_stack_ffffffffffffffc8,(size_t)in_RCX);
  pwVar2 = (word *)wwWordSize(in_RCX,in_RSI);
  bVar1 = wwIsW(in_RCX,(size_t)pwVar2,1);
  if (bVar1 == 0) {
    w = (word *)0x0;
    do {
      while( true ) {
        if (in_RDX <= w) {
          return 0;
        }
        if (_base[(long)w] < 0x100000000) {
          local_48 = zzModW2(in_RCX,(size_t)pwVar2,_base[(long)w]);
        }
        else {
          local_48 = zzModW(in_RDX,(size_t)a_00,(word)w);
        }
        if (local_48 == 0) break;
        w = (word *)((long)w + 1);
      }
      zzDivW(in_RDI,pwVar2,(size_t)in_RDX,(word)a_00);
      pwVar2 = (word *)wwWordSize(in_RCX,(size_t)pwVar2);
      bVar1 = wwIsW(in_RCX,(size_t)pwVar2,1);
    } while (bVar1 == 0);
  }
  return 1;
}

Assistant:

bool_t priIsSmooth(const word a[], size_t n, size_t base_count, void* stack)
{
	register size_t i;
	register word mod;
	// переменные в stack
	word* t = (word*)stack;
	// pre
	ASSERT(base_count <= priBaseSize());
	// t <- a 
	wwCopy(t, a, n);
	// разделить t на степень 2
	i = wwLoZeroBits(t, n);
	wwShLo(t, n, i);
	n = wwWordSize(t, n);
	if (wwIsW(t, n, 1))
	{
		i = 0;
		return TRUE;
	}
	// цикл по простым из факторной базы
	for (i = 0; i < base_count;)
	{
		mod = _base[i] < WORD_BIT_HALF ? 
			zzModW2(t, n, _base[i]) : zzModW(t, n, _base[i]);
		// делится на простое?
		if (mod == 0)
		{
			zzDivW(t, t, n, _base[i]);
			n = wwWordSize(t, n);
			if (wwIsW(t, n, 1))
			{
				i = 0, mod = 0;
				return TRUE;
			}
		}
		// .. не делится
		else 
			++i;
	}
	i = 0, mod = 0;
	return FALSE;
}